

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeRefining.cpp
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::anon_unknown_173::TypeRefining::updateInstructions::ReadUpdater::create(ReadUpdater *this)

{
  undefined1 local_20 [16];
  ReadUpdater *this_local;
  
  this_local = this;
  std::
  make_unique<wasm::(anonymous_namespace)::TypeRefining::updateInstructions(wasm::Module&)::ReadUpdater,wasm::(anonymous_namespace)::TypeRefining&>
            ((TypeRefining *)local_20);
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::(anonymous_namespace)::TypeRefining::updateInstructions(wasm::Module&)::ReadUpdater,std::default_delete<wasm::(anonymous_namespace)::TypeRefining::updateInstructions(wasm::Module&)::ReadUpdater>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this,
             (unique_ptr<ReadUpdater,_std::default_delete<ReadUpdater>_> *)local_20);
  std::unique_ptr<ReadUpdater,_std::default_delete<ReadUpdater>_>::~unique_ptr
            ((unique_ptr<ReadUpdater,_std::default_delete<ReadUpdater>_> *)local_20);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
        return std::make_unique<ReadUpdater>(parent);
      }